

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lspdf.cc
# Opt level: O1

int main(int argc,char **argv)

{
  FilterGainType gain_type;
  char *__s;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *this;
  size_t sVar5;
  string *input_stream;
  int iVar6;
  char *__s_00;
  long lVar7;
  int interpolation_period;
  int frame_period;
  int num_filter_order;
  double signal;
  LineSpectralPairsDigitalFilter filter;
  Buffer buffer;
  vector<double,_std::allocator<double>_> filter_coefficients;
  int tmp;
  ifstream ifs2;
  ifstream ifs1;
  InputSourcePreprocessingForFilterGain preprocessing;
  InputSourceInterpolation interpolation;
  InputSourceFromStream input_source;
  undefined1 auStack_738 [12];
  int local_72c;
  int local_728;
  int local_724;
  string local_720;
  ulong local_700;
  double local_6f8;
  LineSpectralPairsDigitalFilter local_6f0;
  undefined1 local_6e0 [32];
  pointer pdStack_6c0;
  pointer local_6b8;
  pointer pdStack_6b0;
  pointer local_6a8;
  pointer pdStack_6a0;
  pointer local_698;
  vector<double,_std::allocator<double>_> local_690;
  string local_678 [3];
  ios_base local_608 [264];
  string local_500;
  byte abStack_4e0 [80];
  ios_base local_490 [408];
  string local_2f8;
  byte abStack_2d8 [80];
  ios_base local_288 [408];
  InputSourcePreprocessingForFilterGain local_f0;
  InputSourceInterpolation local_d0;
  InputSourceFromStream local_50;
  
  local_724 = 0x19;
  local_728 = 100;
  local_72c = 1;
  local_700 = 0;
  iVar6 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"m:p:i:k:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_2c18::PrintUsage((ostream *)&std::cout);
      iVar6 = 0;
      iVar4 = 1;
      break;
    case 0x69:
      std::__cxx11::string::string((string *)&local_2f8,ya_optarg,(allocator *)&local_500);
      bVar2 = sptk::ConvertStringToInteger(&local_2f8,&local_72c);
      bVar1 = local_72c < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2f8,"The argument for the -i option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2f8,"non-negative integer",0x14);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lspdf","");
        sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2f8);
        goto LAB_00103bb8;
      }
LAB_00103a87:
      iVar4 = 0;
      break;
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
switchD_001037f6_caseD_6a:
      anon_unknown.dwarf_2c18::PrintUsage((ostream *)&std::cerr);
      goto LAB_00103bee;
    case 0x6b:
      std::__cxx11::string::string((string *)&local_2f8,ya_optarg,(allocator *)&local_500);
      bVar2 = sptk::ConvertStringToInteger(&local_2f8,(int *)local_678);
      if (bVar2) {
        bVar2 = sptk::IsInRange((int)local_678[0]._M_dataplus._M_p,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p);
        }
        if (bVar2) {
          iVar4 = 0;
          local_700 = (ulong)local_678[0]._M_dataplus._M_p & 0xffffffff;
          break;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2f8,"The argument for the -k option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2f8,"in the range of ",0x10);
      this = (ostream *)std::ostream::operator<<((ostream *)&local_2f8,0);
      std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
      std::ostream::operator<<((ostream *)this,2);
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lspdf","");
      sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2f8);
      goto LAB_00103bb8;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_2f8,ya_optarg,(allocator *)&local_500);
      bVar2 = sptk::ConvertStringToInteger(&local_2f8,&local_724);
      bVar1 = -1 < local_724;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      if (bVar2 && bVar1) goto LAB_00103a87;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2f8,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2f8,"non-negative integer",0x14);
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lspdf","");
      sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2f8);
      goto LAB_00103bb8;
    case 0x70:
      std::__cxx11::string::string((string *)&local_2f8,ya_optarg,(allocator *)&local_500);
      bVar1 = sptk::ConvertStringToInteger(&local_2f8,&local_728);
      bVar2 = 0 < local_728;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      if (bVar1 && bVar2) goto LAB_00103a87;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2f8,"The argument for the -p option must be a positive integer",
                 0x39);
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lspdf","");
      sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2f8);
LAB_00103bb8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2f8);
      std::ios_base::~ios_base(local_288);
LAB_00103bee:
      iVar4 = 1;
      iVar6 = 1;
      break;
    default:
      if (iVar4 != -1) goto switchD_001037f6_caseD_6a;
      iVar4 = 2;
    }
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return iVar6;
  }
  if (local_728 / 2 < local_72c) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2f8,"Interpolation period must be equal to or less than half ",0x38
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,"frame period",0xc);
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lspdf","");
    sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2f8);
  }
  else {
    if (argc - ya_optind == 1) {
      lVar7 = (long)argc + -1;
      __s_00 = (char *)0x0;
    }
    else {
      if (argc - ya_optind != 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2f8,"Just two input files, wfile and infile, are required",0x34
                  );
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lspdf","");
        sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2f8);
        goto LAB_00103e2b;
      }
      lVar7 = (long)argc + -2;
      __s_00 = argv[(long)argc + -1];
    }
    __s = argv[lVar7];
    bVar2 = sptk::SetBinaryMode();
    if (bVar2) {
      std::ifstream::ifstream(&local_2f8);
      std::ifstream::open((char *)&local_2f8,(_Ios_Openmode)__s);
      if ((abStack_2d8[*(long *)(local_2f8._M_dataplus._M_p + -0x18)] & 5) == 0) {
        input_stream = &local_500;
        std::ifstream::ifstream(input_stream);
        if ((__s_00 == (char *)0x0) ||
           (std::ifstream::open((char *)&local_500,(_Ios_Openmode)__s_00),
           (abStack_4e0[*(long *)(local_500._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            input_stream = (string *)&std::cin;
          }
          iVar6 = 1;
          if ((uint)local_700 < 3) {
            gain_type = *(FilterGainType *)(&DAT_0010c028 + (local_700 & 0xffffffff) * 4);
            lVar7 = (long)local_724;
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_690,lVar7 + 1U,(allocator_type *)local_678);
            sptk::InputSourceFromStream::InputSourceFromStream
                      (&local_50,false,(int)(lVar7 + 1U),(istream *)&local_2f8);
            sptk::InputSourceInterpolation::InputSourceInterpolation
                      (&local_d0,local_728,local_72c,true,&local_50.super_InputSourceInterface);
            sptk::InputSourcePreprocessingForFilterGain::InputSourcePreprocessingForFilterGain
                      (&local_f0,gain_type,&local_d0.super_InputSourceInterface);
            if (local_f0.is_valid_ == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_678,"Failed to initialize InputSource",0x20);
              local_6e0._0_8_ = local_6e0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"lspdf","");
              sptk::PrintErrorMessage((string *)local_6e0,(ostringstream *)local_678);
              if ((undefined1 *)local_6e0._0_8_ != local_6e0 + 0x10) {
                operator_delete((void *)local_6e0._0_8_);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
              std::ios_base::~ios_base(local_608);
              iVar6 = 1;
            }
            else {
              sptk::LineSpectralPairsDigitalFilter::LineSpectralPairsDigitalFilter
                        (&local_6f0,local_724);
              local_6e0._0_8_ = &PTR__Buffer_00111b98;
              local_6e0._8_8_ = (pointer)0x0;
              local_6e0._16_8_ = (pointer)0x0;
              local_6e0._24_8_ = (pointer)0x0;
              pdStack_6c0 = (pointer)0x0;
              local_6b8 = (pointer)0x0;
              pdStack_6b0 = (pointer)0x0;
              local_6a8 = (pointer)0x0;
              pdStack_6a0 = (pointer)0x0;
              local_698 = (pointer)0x0;
              if (local_6f0.is_valid_ == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_678,
                           "Failed to initialize LineSpectralPairsDigitalFilter",0x33);
                local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"lspdf","");
                sptk::PrintErrorMessage(&local_720,(ostringstream *)local_678);
              }
              else {
                do {
                  bVar2 = sptk::ReadStream<double>(&local_6f8,(istream *)input_stream);
                  if (!bVar2) {
                    iVar6 = 0;
                    goto LAB_001043dd;
                  }
                  bVar2 = sptk::InputSourcePreprocessingForFilterGain::Get
                                    (&local_f0,(vector<double,_std::allocator<double>_> *)&local_690
                                    );
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_678,"Cannot get filter coefficients",0x1e);
                    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"lspdf","")
                    ;
                    sptk::PrintErrorMessage(&local_720,(ostringstream *)local_678);
                    goto LAB_001043a7;
                  }
                  bVar2 = sptk::LineSpectralPairsDigitalFilter::Run
                                    (&local_6f0,&local_690,&local_6f8,(Buffer *)local_6e0);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_678,
                               "Failed to apply line spectral pairs digital filter",0x32);
                    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"lspdf","")
                    ;
                    sptk::PrintErrorMessage(&local_720,(ostringstream *)local_678);
                    goto LAB_001043a7;
                  }
                  bVar2 = sptk::WriteStream<double>(local_6f8,(ostream *)&std::cout);
                } while (bVar2);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_678,"Failed to write a filter output",0x1f);
                local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"lspdf","");
                sptk::PrintErrorMessage(&local_720,(ostringstream *)local_678);
              }
LAB_001043a7:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_720._M_dataplus._M_p != &local_720.field_2) {
                operator_delete(local_720._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
              std::ios_base::~ios_base(local_608);
              iVar6 = 1;
LAB_001043dd:
              sptk::LineSpectralPairsDigitalFilter::Buffer::~Buffer((Buffer *)local_6e0);
            }
            sptk::InputSourceInterpolation::~InputSourceInterpolation(&local_d0);
            if (local_690.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_690.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_678,"Cannot open file ",0x11);
          sVar5 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,__s_00,sVar5);
          local_d0.super_InputSourceInterface._vptr_InputSourceInterface =
               (_func_int **)&local_d0.first_interpolation_period_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"lspdf","");
          sptk::PrintErrorMessage((string *)&local_d0,(ostringstream *)local_678);
          if (local_d0.super_InputSourceInterface._vptr_InputSourceInterface !=
              (_func_int **)&local_d0.first_interpolation_period_) {
            operator_delete(local_d0.super_InputSourceInterface._vptr_InputSourceInterface);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
          std::ios_base::~ios_base(local_608);
          iVar6 = 1;
        }
        std::ifstream::~ifstream(&local_500);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_500);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_500,"Cannot open file ",0x11);
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_738 +
                          (int)*(undefined8 *)(local_500._M_dataplus._M_p + -0x18) + 0x238);
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_500,__s,sVar5);
        }
        local_678[0]._M_dataplus._M_p = (pointer)&local_678[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"lspdf","");
        sptk::PrintErrorMessage(local_678,(ostringstream *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_678[0]._M_dataplus._M_p != &local_678[0].field_2) {
          operator_delete(local_678[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_500);
        std::ios_base::~ios_base(local_490);
        iVar6 = 1;
      }
      std::ifstream::~ifstream(&local_2f8);
      return iVar6;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2f8,"Cannot set translation mode",0x1b);
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"lspdf","");
    sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2f8);
  }
LAB_00103e2b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2f8);
  std::ios_base::~ios_base(local_288);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  LocalGainType local_gain_type(kDefaultGainType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:p:i:k:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        const int min(0);
        const int max(static_cast<int>(kNumGainTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -k option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        local_gain_type = static_cast<LocalGainType>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, wfile and infile, are required";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  sptk::InputSourcePreprocessingForFilterGain::FilterGainType gain_type;
  switch (local_gain_type) {
    case kLinear: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kLinear;
      break;
    }
    case kLog: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kLog;
      break;
    }
    case kUnity: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kUnity;
      break;
    }
    default: {
      return 1;
    }
  }

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &input_source);
  sptk::InputSourcePreprocessingForFilterGain preprocessing(gain_type,
                                                            &interpolation);
  if (!preprocessing.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  sptk::LineSpectralPairsDigitalFilter filter(num_filter_order);
  sptk::LineSpectralPairsDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LineSpectralPairsDigitalFilter";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!preprocessing.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply line spectral pairs digital filter";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }
  }

  return 0;
}